

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViewPattern.cpp
# Opt level: O3

void __thiscall ViewPattern::ViewPattern(ViewPattern *this,string *name,View *view)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  this->view = view;
  return;
}

Assistant:

ViewPattern::ViewPattern(const string &name, View *view) : name(name), view(view) {}